

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::handleExceptionMatchExpr(AssertionHandler *handler,string *str,StringRef *matcherString)

{
  StringEqualsMatcher local_98;
  StringRef *local_20;
  StringRef *matcherString_local;
  string *str_local;
  AssertionHandler *handler_local;
  
  local_20 = matcherString;
  matcherString_local = (StringRef *)str;
  str_local = (string *)handler;
  Matchers::Equals(&local_98,str,Yes);
  handleExceptionMatchExpr(handler,(StringMatcher *)&local_98,local_20);
  Matchers::StringEqualsMatcher::~StringEqualsMatcher(&local_98);
  return;
}

Assistant:

void handleExceptionMatchExpr(AssertionHandler &handler, std::string const &str, StringRef const &matcherString) {
        handleExceptionMatchExpr(handler, Matchers::Equals(str), matcherString);
    }